

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_stub.c
# Opt level: O0

int ld_psupp(part_t *pp,int mode)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = ld_psupp::count + 1;
  bVar2 = ld_psupp::count == 0;
  ld_psupp::count = iVar1;
  if (bVar2) {
    printf("%s %s\n","No load routine has been defined for the","psupp table\n");
  }
  return 0;
}

Assistant:

int 
ld_psupp (part_t *pp, int mode)
{
    static int count = 0;
	UNUSED(pp);
	UNUSED(mode);

    if (! count++)
        printf("%s %s\n",
            "No load routine has been defined for the",
            "psupp table\n");

    return(0);

}